

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O3

XMLSize_t xercesc_4_0::XMLString::hash(char *tohash,XMLSize_t hashModulus)

{
  ulong uVar1;
  char cVar2;
  char *pcVar3;
  
  if ((tohash == (char *)0x0) || (cVar2 = *tohash, cVar2 == '\0')) {
    uVar1 = 0;
  }
  else {
    pcVar3 = tohash + 1;
    uVar1 = 0;
    do {
      uVar1 = (uVar1 >> 0x18) + uVar1 + uVar1 * 0x25 + (long)cVar2;
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
  }
  return uVar1 % hashModulus;
}

Assistant:

XMLSize_t XMLString::hash(   const   char* const    tohash
                            , const XMLSize_t       hashModulus)
{
    XMLSize_t hashVal = 0;
    if (tohash) {
        const char* curCh = tohash;
        while (*curCh)
        {
            XMLSize_t top = hashVal >> 24;
            hashVal += (hashVal * 37) + top + (XMLSize_t)(*curCh);
            curCh++;
        }
    }

    // Divide by modulus
    return hashVal % hashModulus;
}